

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ModportNamedPortSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::ModportNamedPortSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  ModportNamedPortSyntax *pMVar6;
  
  pMVar6 = (ModportNamedPortSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ModportNamedPortSyntax *)this->endPtr < pMVar6 + 1) {
    pMVar6 = (ModportNamedPortSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pMVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pMVar6->super_ModportPortSyntax).super_SyntaxNode.kind = ModportNamedPort;
  (pMVar6->super_ModportPortSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pMVar6->super_ModportPortSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pMVar6->name).kind = TVar2;
  (pMVar6->name).field_0x2 = uVar3;
  (pMVar6->name).numFlags = (NumericTokenFlags)NVar4.raw;
  (pMVar6->name).rawLen = uVar5;
  (pMVar6->name).info = pIVar1;
  return pMVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }